

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_log.cpp
# Opt level: O0

void duckdb::DuckDBLogFun::RegisterFunction(BuiltinFunctions *set)

{
  TableFunction *in_RDI;
  BuiltinFunctions *unaff_retaddr;
  TableFunction logs_fun;
  TableFunction *in_stack_fffffffffffffc10;
  TableFunction *this;
  table_function_init_global_t in_stack_fffffffffffffc88;
  table_function_bind_t in_stack_fffffffffffffc90;
  table_function_t in_stack_fffffffffffffc98;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffca8;
  TableFunction *in_stack_fffffffffffffcb0;
  table_function_init_local_t in_stack_fffffffffffffcc0;
  undefined1 local_218 [56];
  string local_1e0 [472];
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_1e0,"duckdb_logs",(allocator *)(local_218 + 0x37));
  local_218._0_8_ = (_func_int **)0x0;
  local_218._8_8_ = 0;
  local_218._16_8_ = 0;
  this = (TableFunction *)local_218;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x140bfc5);
  TableFunction::TableFunction
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
             in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             in_stack_fffffffffffffcc0);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x140c00d);
  ::std::__cxx11::string::~string(local_1e0);
  ::std::allocator<char>::~allocator((allocator<char> *)(local_218 + 0x37));
  TableFunction::TableFunction(this,in_RDI);
  BuiltinFunctions::AddFunction(unaff_retaddr,in_RDI);
  TableFunction::~TableFunction(in_stack_fffffffffffffc10);
  TableFunction::~TableFunction(in_stack_fffffffffffffc10);
  return;
}

Assistant:

void DuckDBLogFun::RegisterFunction(BuiltinFunctions &set) {
	TableFunction logs_fun("duckdb_logs", {}, DuckDBLogFunction, DuckDBLogBind, DuckDBLogInit);
	set.AddFunction(logs_fun);
}